

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float __thiscall
tcu::TextureCubeView::sampleCompare
          (TextureCubeView *this,Sampler *sampler,float ref,float s,float t,float r,float lod)

{
  int *piVar1;
  FilterMode FVar2;
  TextureFormat TVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  CubeFace baseFace;
  ConstPixelBufferAccess *pCVar11;
  long lVar12;
  int iVar13;
  ConstPixelBufferAccess **ppCVar14;
  float t_00;
  float fVar15;
  float fVar16;
  CubeFaceFloatCoords CVar17;
  ConstPixelBufferAccess faceAccesses [6];
  float local_21c;
  undefined1 local_218 [16];
  undefined8 auStack_208 [28];
  undefined1 local_128 [16];
  undefined8 auStack_118 [29];
  
  local_218._4_4_ = t;
  local_218._0_4_ = s;
  local_218._8_4_ = r;
  CVar17 = getCubeFaceCoords((Vec3 *)local_218);
  t_00 = CVar17.t;
  uVar8 = CVar17._0_8_;
  fVar16 = CVar17.s;
  if (sampler->seamlessCubeMap == true) {
    FVar2 = (&sampler->minFilter)[lod <= sampler->lodThreshold];
    if (FVar2 < FILTERMODE_LAST) {
      ppCVar14 = this->m_levels;
      baseFace = CVar17.face;
      switch(FVar2) {
      case NEAREST:
        pCVar11 = ppCVar14[uVar8 & 0xffffffff];
LAB_0030551d:
        fVar16 = sampleCubeSeamlessNearestCompare(pCVar11,sampler,ref,fVar16,t_00,0);
        return fVar16;
      case LINEAR:
        lVar12 = 0;
        do {
          ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)(local_218 + lVar12));
          lVar12 = lVar12 + 0x28;
        } while (lVar12 != 0xf0);
        for (lVar12 = 0; lVar12 != 0x1e; lVar12 = lVar12 + 5) {
          pCVar11 = *ppCVar14;
          *(void **)(local_218 + lVar12 * 8 + 0x20) = pCVar11->m_data;
          TVar3 = pCVar11->m_format;
          uVar4 = *(undefined8 *)(pCVar11->m_size).m_data;
          uVar5 = *(undefined8 *)((pCVar11->m_pitch).m_data + 1);
          *(undefined8 *)(local_218 + lVar12 * 8 + 0x10) =
               *(undefined8 *)((pCVar11->m_size).m_data + 2);
          *(undefined8 *)(local_218 + lVar12 * 8 + 0x18) = uVar5;
          *(TextureFormat *)(local_218 + (lVar12 * 2 + -2) * 4 + 8) = TVar3;
          *(undefined8 *)(local_218 + lVar12 * 8 + 8) = uVar4;
          ppCVar14 = ppCVar14 + 1;
        }
        break;
      default:
        iVar9 = this->m_numLevels + -1;
        fVar15 = ceilf(lod + 0.5);
        iVar10 = (int)fVar15 + -1;
        if (iVar10 < iVar9) {
          iVar9 = iVar10;
        }
        iVar7 = 0;
        if (-1 < iVar10) {
          iVar7 = iVar9;
        }
        if (FVar2 != LINEAR_MIPMAP_NEAREST) {
          pCVar11 = ppCVar14[uVar8 & 0xffffffff] + iVar7;
          goto LAB_0030551d;
        }
        lVar12 = 0;
        do {
          ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)(local_218 + lVar12));
          lVar12 = lVar12 + 0x28;
        } while (lVar12 != 0xf0);
        for (lVar12 = 0; lVar12 != 0x1e; lVar12 = lVar12 + 5) {
          pCVar11 = *ppCVar14;
          *(void **)(local_218 + lVar12 * 8 + 0x20) = pCVar11[iVar7].m_data;
          TVar3 = pCVar11[iVar7].m_format;
          uVar4 = *(undefined8 *)pCVar11[iVar7].m_size.m_data;
          piVar1 = pCVar11[iVar7].m_size.m_data + 2;
          uVar5 = *(undefined8 *)(piVar1 + 2);
          *(undefined8 *)(local_218 + lVar12 * 8 + 0x10) = *(undefined8 *)piVar1;
          *(undefined8 *)(local_218 + lVar12 * 8 + 0x18) = uVar5;
          *(TextureFormat *)(local_218 + (lVar12 * 2 + -2) * 4 + 8) = TVar3;
          *(undefined8 *)(local_218 + lVar12 * 8 + 8) = uVar4;
          ppCVar14 = ppCVar14 + 1;
        }
        break;
      case NEAREST_MIPMAP_LINEAR:
      case LINEAR_MIPMAP_LINEAR:
        iVar10 = this->m_numLevels + -1;
        fVar15 = floorf(lod);
        iVar7 = (int)fVar15;
        iVar9 = iVar10;
        if (iVar7 < iVar10) {
          iVar9 = iVar7;
        }
        iVar13 = 0;
        if (-1 < iVar7) {
          iVar13 = iVar9;
        }
        if (iVar13 + 1 <= iVar10) {
          iVar10 = iVar13 + 1;
        }
        if (FVar2 == LINEAR_MIPMAP_LINEAR) {
          lVar12 = 0;
          do {
            ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)(local_218 + lVar12));
            lVar12 = lVar12 + 0x28;
          } while (lVar12 != 0xf0);
          lVar12 = 0;
          do {
            ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)(local_128 + lVar12));
            lVar12 = lVar12 + 0x28;
          } while (lVar12 != 0xf0);
          for (lVar12 = 0; lVar12 != 0x1e; lVar12 = lVar12 + 5) {
            pCVar11 = *ppCVar14;
            *(void **)(local_218 + lVar12 * 8 + 0x20) = pCVar11[iVar13].m_data;
            TVar3 = pCVar11[iVar13].m_format;
            uVar4 = *(undefined8 *)pCVar11[iVar13].m_size.m_data;
            piVar1 = pCVar11[iVar13].m_size.m_data + 2;
            uVar5 = *(undefined8 *)(piVar1 + 2);
            *(undefined8 *)(local_218 + lVar12 * 8 + 0x10) = *(undefined8 *)piVar1;
            *(undefined8 *)(local_218 + lVar12 * 8 + 0x18) = uVar5;
            *(TextureFormat *)(local_218 + (lVar12 * 2 + -2) * 4 + 8) = TVar3;
            *(undefined8 *)(local_218 + lVar12 * 8 + 8) = uVar4;
            uVar4 = *(undefined8 *)pCVar11[iVar10].m_size.m_data;
            piVar1 = pCVar11[iVar10].m_size.m_data + 2;
            uVar5 = *(undefined8 *)piVar1;
            uVar6 = *(undefined8 *)(piVar1 + 2);
            *(TextureFormat *)(local_128 + (lVar12 * 2 + -2) * 4 + 8) = pCVar11[iVar10].m_format;
            *(undefined8 *)(local_128 + lVar12 * 8 + 8) = uVar4;
            *(undefined8 *)(local_128 + lVar12 * 8 + 0x10) = uVar5;
            *(undefined8 *)(local_128 + lVar12 * 8 + 0x18) = uVar6;
            *(void **)(local_128 + lVar12 * 8 + 0x20) = pCVar11[iVar10].m_data;
            ppCVar14 = ppCVar14 + 1;
          }
          local_21c = sampleCubeSeamlessLinearCompare
                                ((ConstPixelBufferAccess (*) [6])local_218,baseFace,sampler,ref,
                                 fVar16,t_00);
          fVar16 = sampleCubeSeamlessLinearCompare
                             ((ConstPixelBufferAccess (*) [6])local_128,baseFace,sampler,ref,fVar16,
                              t_00);
        }
        else {
          local_21c = sampleCubeSeamlessNearestCompare
                                (ppCVar14[uVar8 & 0xffffffff] + iVar13,sampler,ref,fVar16,t_00,0);
          fVar16 = sampleCubeSeamlessNearestCompare
                             (ppCVar14[uVar8 & 0xffffffff] + iVar10,sampler,ref,fVar16,t_00,0);
        }
        return fVar16 * (lod - fVar15) + (1.0 - (lod - fVar15)) * local_21c;
      }
      fVar16 = sampleCubeSeamlessLinearCompare
                         ((ConstPixelBufferAccess (*) [6])local_218,baseFace,sampler,ref,fVar16,t_00
                         );
    }
    else {
      fVar16 = 0.0;
    }
  }
  else {
    local_218._0_4_ = R;
    local_218._4_4_ = SNORM_INT8;
    local_218._8_4_ = 0.0;
    fVar16 = sampleLevelArray2DCompare
                       (this->m_levels[uVar8 & 0xffffffff],this->m_numLevels,sampler,ref,fVar16,t_00
                        ,lod,(IVec3 *)local_218);
  }
  return fVar16;
}

Assistant:

float TextureCubeView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float r, float lod) const
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);

	// Computes (face, s, t).
	const CubeFaceFloatCoords coords = getCubeFaceCoords(Vec3(s, t, r));
	if (sampler.seamlessCubeMap)
		return sampleLevelArrayCubeSeamlessCompare(m_levels, m_numLevels, coords.face, sampler, ref, coords.s, coords.t, lod);
	else
		return sampleLevelArray2DCompare(m_levels[coords.face], m_numLevels, sampler, ref, coords.s, coords.t, lod, IVec3(0, 0, 0));
}